

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

bool util::parseTime(string *in,timespec *ts)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  runtime_error *this;
  time_t *in_RSI;
  time_t t;
  int num;
  int dec;
  char *pos;
  long tv_nsec;
  tm tm;
  char *buf;
  int *in_stack_000000d0;
  char (*in_stack_000000d8) [2];
  char (*in_stack_000000e0) [90];
  char (*in_stack_000000e8) [29];
  string local_98 [32];
  time_t local_78;
  undefined4 local_70;
  int local_6c;
  char *local_68;
  time_t local_60;
  tm local_58;
  char *local_20;
  time_t *local_18;
  
  local_18 = in_RSI;
  local_20 = (char *)std::__cxx11::string::c_str();
  memset(&local_58,0,0x38);
  local_60 = 0;
  pcVar3 = strptime(local_20,"%Y-%m-%dT%H:%M:%S",&local_58);
  pcVar1 = local_20;
  local_68 = pcVar3;
  lVar4 = std::__cxx11::string::size();
  if (pcVar3 < pcVar1 + lVar4) {
    if (*local_68 != '.') {
      return false;
    }
    local_6c = 0;
    iVar2 = __isoc99_sscanf(local_68,".%dZ",&local_6c);
    if ((iVar2 != 1) || (9 < local_6c)) {
      return false;
    }
    local_18[1] = 100000000;
    local_70 = 1;
  }
  local_78 = mktime(&local_58);
  if (0 < local_78) {
    *local_18 = local_78;
    local_18[1] = local_60;
    return true;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  str<char[29],char[90],char[2],int>
            (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  std::runtime_error::runtime_error(this,local_98);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool parseTime(const std::string& in, struct timespec* ts) {
  const char* buf = in.c_str();
  struct tm tm;

  // Initialize tm struct to 0s before using it, otherwise mktime will behave unpredictably - Kons
  memset(&tm, 0x0, sizeof(tm));

  long int tv_nsec = 0;

  // For example: 2017-12-21T17:46:32.2Z
  char* pos = strptime(buf, "%Y-%m-%dT%H:%M:%S", &tm);
  if (pos < (buf + in.size())) {
    if (pos[0] == '.') {
      // Expect single decimal for fractional second
      int dec = 0;
      int num = sscanf(pos, ".%dZ", &dec);
      if (num == 1 && dec < 10) {
        ts->tv_nsec = num * 100000000;
      } else {
        return false;
      }
    } else {
      return false;
    }
  }

  auto t = mktime(&tm);

  // The resulting t should always be greater 0, otherwise there was a problem with date conversion
  ASSERT(t > 0);

  ts->tv_sec = t;
  ts->tv_nsec = tv_nsec;
  return true;
}